

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
::doApply(IRet *__return_storage_ptr__,
         GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
         *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *pIVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  Interval *local_68;
  Interval *local_60;
  Interval *local_58;
  Void *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  double local_38;
  
  lVar3 = 0;
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_data[0].m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[0].m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_data[0].m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[0].m_hi + 4) = 0xfff00000;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_data[1].m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[1].m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_data[1].m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[1].m_hi + 4) = 0xfff00000;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    local_68 = iargs->a->m_data + lVar3;
    local_60 = iargs->b->m_data + lVar3;
    local_58 = iargs->c->m_data + lVar3;
    local_50 = iargs->d;
    (*(this->m_func->super_FuncBase)._vptr_FuncBase[8])(&local_48,this->m_func,ctx,&local_68);
    __return_storage_ptr__->m_data[lVar3].m_hi = local_38;
    pIVar1 = __return_storage_ptr__->m_data + lVar3;
    *(undefined4 *)pIVar1 = local_48;
    *(undefined4 *)&pIVar1->field_0x4 = uStack_44;
    *(undefined4 *)&pIVar1->m_lo = uStack_40;
    *(undefined4 *)((long)&pIVar1->m_lo + 4) = uStack_3c;
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply					(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet ret;

		for (int ndx = 0; ndx < Size; ++ndx)
		{
			ret[ndx] =
				m_func.apply(ctx, iargs.a[ndx], iargs.b[ndx], iargs.c[ndx], iargs.d[ndx]);
		}

		return ret;
	}